

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_encoder_tests.cpp
# Opt level: O2

void anon_unknown.dwarf_cb579::test_equal
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *v,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *expected)

{
  ulong uVar1;
  SourceLineInfo local_e8;
  StringRef local_d8;
  BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&> local_c8;
  unsigned_long local_98;
  long local_90;
  AssertionHandler catchAssertionHandler;
  StringRef local_40;
  
  local_c8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x65aae6;
  local_c8.super_ITransientExpression.m_isBinaryExpression = true;
  local_c8.super_ITransientExpression.m_result = false;
  local_c8.super_ITransientExpression._10_6_ = 0;
  local_e8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_encoder_tests.cpp"
  ;
  local_e8.line = 0x14;
  Catch::StringRef::StringRef(&local_40,"v.size() == expected.size()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_c8,&local_e8,local_40,Normal);
  local_90 = (long)(v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  local_e8.file = (char *)&local_90;
  local_98 = (long)(expected->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(expected->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
  Catch::ExprLhs<unsigned_long_const&>::operator==
            (&local_c8,(ExprLhs<unsigned_long_const&> *)&local_e8,&local_98);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_c8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_c8.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  for (uVar1 = 0;
      uVar1 < (ulong)((long)(v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start); uVar1 = uVar1 + 1) {
    local_c8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x6522ad;
    local_c8.super_ITransientExpression.m_isBinaryExpression = true;
    local_c8.super_ITransientExpression.m_result = false;
    local_c8.super_ITransientExpression._10_6_ = 0;
    local_e8.file =
         "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_encoder_tests.cpp"
    ;
    local_e8.line = 0x18;
    Catch::StringRef::StringRef(&local_d8,"v[i] == expected[i]");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_c8,&local_e8,local_d8,ContinueOnFailure);
    local_e8.file =
         (char *)((v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_start + uVar1);
    Catch::ExprLhs<unsigned_char_const&>::operator==
              ((BinaryExpr<const_unsigned_char_&,_const_unsigned_char_&> *)&local_c8,
               (ExprLhs<unsigned_char_const&> *)&local_e8,
               (expected->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
               .super__Vector_impl_data._M_start + uVar1);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_c8.super_ITransientExpression)
    ;
    Catch::ITransientExpression::~ITransientExpression(&local_c8.super_ITransientExpression);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  }
  return;
}

Assistant:

void test_equal(const std::vector<uint8_t>& v, const std::vector<uint8_t>& expected)
    {
        REQUIRE(v.size() == expected.size());

        for (std::size_t i = 0; i < v.size(); ++i)
        {
            CHECK(v[i] == expected[i]);
        }
    }